

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void set_cached_x509_store(Curl_cfilter *cf,Curl_easy *data,X509_STORE *store)

{
  Curl_multi *pCVar1;
  int iVar2;
  ssl_primary_config *psVar3;
  void *pvVar4;
  curltime cVar5;
  undefined4 uStack_44;
  char *local_40;
  char *CAfile;
  ossl_x509_share *share;
  Curl_multi *multi;
  ssl_primary_config *conn_config;
  X509_STORE *store_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  psVar3 = Curl_ssl_cf_get_primary_config(cf);
  pCVar1 = data->multi;
  if (pCVar1 == (Curl_multi *)0x0) {
    return;
  }
  CAfile = (char *)Curl_hash_pick(&pCVar1->proto_hash,"tls:ossl:x509:share",0x13);
  if (CAfile == (char *)0x0) {
    CAfile = (char *)(*Curl_ccalloc)(1,0x20);
    if (CAfile == (char *)0x0) {
      return;
    }
    pvVar4 = Curl_hash_add2(&pCVar1->proto_hash,"tls:ossl:x509:share",0x13,CAfile,
                            oss_x509_share_free);
    if (pvVar4 == (void *)0x0) {
      (*Curl_cfree)(CAfile);
      return;
    }
  }
  iVar2 = X509_STORE_up_ref(store);
  if (iVar2 != 0) {
    local_40 = (char *)0x0;
    if ((psVar3->CAfile == (char *)0x0) ||
       (local_40 = (*Curl_cstrdup)(psVar3->CAfile), local_40 != (char *)0x0)) {
      if (*(long *)(CAfile + 8) != 0) {
        X509_STORE_free(*(X509_STORE **)(CAfile + 8));
        (*Curl_cfree)(*(void **)CAfile);
      }
      cVar5 = Curl_now();
      *(time_t *)(CAfile + 0x10) = cVar5.tv_sec;
      *(ulong *)(CAfile + 0x18) = CONCAT44(uStack_44,cVar5.tv_usec);
      *(X509_STORE **)(CAfile + 8) = store;
      *(char **)CAfile = local_40;
    }
    else {
      X509_STORE_free((X509_STORE *)store);
    }
  }
  return;
}

Assistant:

static void set_cached_x509_store(struct Curl_cfilter *cf,
                                  const struct Curl_easy *data,
                                  X509_STORE *store)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_multi *multi = data->multi;
  struct ossl_x509_share *share;

  DEBUGASSERT(multi);
  if(!multi)
    return;
  share = Curl_hash_pick(&multi->proto_hash,
                         (void *)MPROTO_OSSL_X509_KEY,
                         sizeof(MPROTO_OSSL_X509_KEY)-1);

  if(!share) {
    share = calloc(1, sizeof(*share));
    if(!share)
      return;
    if(!Curl_hash_add2(&multi->proto_hash,
                       (void *)MPROTO_OSSL_X509_KEY,
                       sizeof(MPROTO_OSSL_X509_KEY)-1,
                       share, oss_x509_share_free)) {
      free(share);
      return;
    }
  }

  if(X509_STORE_up_ref(store)) {
    char *CAfile = NULL;

    if(conn_config->CAfile) {
      CAfile = strdup(conn_config->CAfile);
      if(!CAfile) {
        X509_STORE_free(store);
        return;
      }
    }

    if(share->store) {
      X509_STORE_free(share->store);
      free(share->CAfile);
    }

    share->time = Curl_now();
    share->store = store;
    share->CAfile = CAfile;
  }
}